

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O3

_Bool run_container_validate(run_container_t *run,char **reason)

{
  uint uVar1;
  rle16_t *prVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar1 = run->n_runs;
  if ((int)uVar1 < 0) {
    pcVar4 = "negative run count";
  }
  else if (run->capacity < 0) {
    pcVar4 = "negative run capacity";
  }
  else if ((uint)run->capacity < uVar1) {
    pcVar4 = "capacity less than run count";
  }
  else if ((ulong)uVar1 == 0) {
    pcVar4 = "zero run count";
  }
  else {
    prVar2 = run->runs;
    if (prVar2 == (rle16_t *)0x0) {
      pcVar4 = "NULL runs";
    }
    else {
      uVar5 = 0;
      pcVar4 = "run start + length too large";
      uVar6 = 0;
      while( true ) {
        uVar3 = (uint)prVar2[uVar5].value;
        if (0xffff < prVar2[uVar5].length + uVar3) break;
        if (uVar3 < uVar6) {
          pcVar4 = "run start less than last end";
          break;
        }
        if ((uVar6 != 0) && (uVar6 == uVar3)) {
          pcVar4 = "run start equal to last end, should have combined";
          break;
        }
        uVar6 = prVar2[uVar5].length + uVar3 + 1;
        uVar5 = uVar5 + 1;
        if (uVar1 == uVar5) {
          return true;
        }
      }
    }
  }
  *reason = pcVar4;
  return false;
}

Assistant:

bool run_container_validate(const run_container_t *run, const char **reason) {
    if (run->n_runs < 0) {
        *reason = "negative run count";
        return false;
    }
    if (run->capacity < 0) {
        *reason = "negative run capacity";
        return false;
    }
    if (run->capacity < run->n_runs) {
        *reason = "capacity less than run count";
        return false;
    }

    if (run->n_runs == 0) {
        *reason = "zero run count";
        return false;
    }
    if (run->runs == NULL) {
        *reason = "NULL runs";
        return false;
    }

    // Use uint32_t to avoid overflow issues on ranges that contain UINT16_MAX.
    uint32_t last_end = 0;
    for (int i = 0; i < run->n_runs; ++i) {
        uint32_t start = run->runs[i].value;
        uint32_t end = start + run->runs[i].length + 1;
        if (end <= start) {
            *reason = "run start + length overflow";
            return false;
        }
        if (end > (1 << 16)) {
            *reason = "run start + length too large";
            return false;
        }
        if (start < last_end) {
            *reason = "run start less than last end";
            return false;
        }
        if (start == last_end && last_end != 0) {
            *reason = "run start equal to last end, should have combined";
            return false;
        }
        last_end = end;
    }
    return true;
}